

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void hatch_egg(void *arg,long timeout)

{
  char cVar1;
  level *lev;
  bool bVar2;
  byte bVar3;
  boolean bVar4;
  int mnum;
  int iVar5;
  uint uVar6;
  monst *pmVar7;
  monst *pmVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  monst *mtmp;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  xchar y;
  xchar x;
  byte local_250;
  byte local_24f;
  coord cc;
  byte local_24c;
  char carriedby [256];
  char monnambuf [256];
  
  if (*(int *)((long)arg + 0x50) == -1) {
    return;
  }
  mnum = big_to_little(*(int *)((long)arg + 0x50));
  if (*(char *)((long)arg + 0x34) == '\0') {
    local_24c = 1;
    if ((flags.female == '\0') && (*(char *)((long)arg + 0x48) == '\x03')) {
      uVar6 = mt_random();
      local_24c = (byte)uVar6 & 1;
    }
  }
  else {
    local_24c = 0;
  }
  uVar14 = (ulong)moves;
  bVar4 = get_obj_location((obj *)arg,&x,&y,0);
  if (bVar4 == '\0') {
    return;
  }
  iVar5 = rnd(*(int *)((long)arg + 0x30));
  if ((mons[mnum].geno & 0x1000) != 0) {
    return;
  }
  if ((mvitals[mnum].mvflags & 3) != 0) {
    return;
  }
  local_250 = (byte)viz_array[y][x] >> 1 & uVar14 == timeout;
  local_24f = uVar14 != timeout | local_24c;
  mtmp = (monst *)0x0;
  for (iVar12 = iVar5; pmVar7 = mtmp, 0 < iVar12; iVar12 = iVar12 + -1) {
    bVar4 = enexto(&cc,level,x,y,mons + mnum);
    if (bVar4 == '\0') goto LAB_0024d2d4;
    pmVar7 = makemon(mons + mnum,level,(int)cc.x,(int)cc.y,1);
    if (pmVar7 == (monst *)0x0) {
      pmVar7 = (monst *)0x0;
      goto LAB_0024d2d4;
    }
    if ((local_24f == 0) ||
       ((*(char *)((long)arg + 0x48) == '\x03' && (pmVar7->data->mlet == '\x1e')))) {
      pmVar8 = tamedog(pmVar7,(obj *)0x0);
      mtmp = (monst *)0x0;
      if ((pmVar8 != (monst *)0x0) &&
         ((mtmp = pmVar8, pmVar7 = pmVar8, *(char *)((long)arg + 0x48) == '\x03' &&
          (pmVar8->data->mlet != '\x1e')))) {
        pmVar8->mtame = '\x14';
      }
    }
    if ((mvitals[mnum].mvflags & 1) != 0) goto LAB_0024d2d4;
    mtmp = pmVar7;
  }
  iVar12 = 0;
LAB_0024d2d4:
  bVar3 = local_250;
  if (pmVar7 != (monst *)0x0) {
    mtmp = pmVar7;
  }
  iVar5 = iVar5 - iVar12;
  *(int *)((long)arg + 0x30) = *(int *)((long)arg + 0x30) - iVar5;
  if (mtmp == (monst *)0x0) {
    return;
  }
  if (local_250 != 0) {
    pcVar9 = m_monnam(mtmp);
    pcVar13 = "";
    if (iVar5 < 2) {
      pcVar9 = an(pcVar9);
    }
    else {
      pcVar13 = "some ";
      pcVar9 = makeplural(pcVar9);
    }
    sprintf(monnambuf,"%s%s",pcVar13,pcVar9);
  }
  cVar1 = *(char *)((long)arg + 0x48);
  if (cVar1 == '\x01') {
    bVar2 = true;
    if (bVar3 == 0) goto LAB_0024d669;
    bVar2 = false;
    pline("You see %s hatch.");
    bVar11 = 1;
  }
  else {
    if (cVar1 == '\x04') {
      bVar2 = true;
      if (bVar3 == 0) goto LAB_0024d669;
      pmVar7 = *(monst **)((long)arg + 8);
      if (pmVar7->wormno == '\0') {
        if ((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) goto LAB_0024d561;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024d4fe;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024d4f5;
        }
        else {
LAB_0024d4f5:
          if (ublindf == (obj *)0x0) goto LAB_0024d5de;
LAB_0024d4fe:
          if (ublindf->oartifact != '\x1d') goto LAB_0024d5de;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0)) &&
           ((pmVar7->data->mflags3 & 0x200) != 0)) goto LAB_0024d561;
LAB_0024d5de:
        bVar4 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
        if (bVar4 == '\0') {
          builtin_strncpy(carriedby,"thin air",8);
          carriedby._8_4_ = carriedby._8_4_ & 0xffffff00;
        }
        else {
          builtin_strncpy(carriedby,"empty water",0xc);
        }
        bVar11 = 0;
      }
      else {
        bVar4 = worm_known(level,pmVar7);
        if (bVar4 == '\0') goto LAB_0024d5de;
        pmVar7 = *(monst **)((long)arg + 8);
LAB_0024d561:
        uVar6 = *(uint *)&pmVar7->field_0x60;
        if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)
           ) {
          if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_0024d5a7;
          goto LAB_0024d5de;
        }
        if ((uVar6 & 0x280) != 0) goto LAB_0024d5de;
LAB_0024d5a7:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_0024d5de;
        pcVar13 = a_monnam(pmVar7);
        pcVar13 = s_suffix(pcVar13);
        sprintf(carriedby,"%s pack",pcVar13);
        bVar11 = 1;
      }
      pcVar13 = locomotion(mtmp->data,"drop");
      pline("You see %s %s out of %s!",monnambuf,pcVar13,carriedby);
    }
    else {
      if (cVar1 != '\x03') {
        warning("egg hatched where? (%d)");
        bVar2 = true;
        goto LAB_0024d669;
      }
      pcVar13 = locomotion(mtmp->data,"drop");
      if (bVar3 == 0) {
        pline("You feel something %s from your pack!");
      }
      else {
        pline("You see %s %s out of your pack!",monnambuf,pcVar13);
      }
      if (local_24c == 0) {
        pcVar13 = "Its";
        if (1 < iVar5) {
          pcVar13 = "Their";
        }
        pcVar9 = "mommy";
        if (flags.female == '\0') {
          pcVar9 = "daddy";
        }
        pcVar10 = ".";
        if (*(char *)((long)arg + 0x34) == '\0') {
          pcVar10 = "?";
        }
        pline("%s cries sound like \"%s%s\"",pcVar13,pcVar9,pcVar10);
        bVar11 = 1;
      }
      else {
        bVar11 = 1;
        if (mtmp->data->mlet == '\x1e') {
          verbalize("Gleep!");
        }
      }
    }
    bVar2 = true;
  }
  if ((bVar3 & bVar11) == 1) {
    learn_egg_type(mnum);
  }
LAB_0024d669:
  if (*(int *)((long)arg + 0x30) < 1) {
    if (*(char *)((long)arg + 0x48) == '\x03') {
      useup((obj *)arg);
    }
    else {
      obj_extract_self((obj *)arg);
      obfree((obj *)arg,(obj *)0x0);
    }
  }
  else {
    attach_egg_hatch_timeout((obj *)arg);
    if (*(char *)((long)arg + 0x49) != '\0') {
      stop_timer(*(level **)((long)arg + 0x20),4,arg);
      lev = *(level **)((long)arg + 0x20);
      uVar6 = rnd(0xc);
      start_timer(lev,(ulong)uVar6,2,4,arg);
    }
  }
  if (!bVar2) {
    newsym((int)x,(int)y);
  }
  return;
}

Assistant:

void hatch_egg(void *arg, long timeout)
{
	struct obj *egg;
	struct monst *mon, *mon2;
	coord cc;
	xchar x, y;
	boolean yours, silent, knows_egg = FALSE;
	boolean cansee_hatchspot = FALSE;
	int i, mnum, hatchcount = 0;

	egg = (struct obj *) arg;
	/* sterilized while waiting */
	if (egg->corpsenm == NON_PM) return;

	mon = mon2 = NULL;
	mnum = big_to_little(egg->corpsenm);
	/* The identity of one's father is learned, not innate */
	yours = (egg->spe || (!flags.female && carried(egg) && !rn2(2)));
	silent = (timeout != moves);	/* hatched while away */

	/* only can hatch when in INVENT, FLOOR, MINVENT */
	if (get_obj_location(egg, &x, &y, 0)) {
	    hatchcount = rnd((int)egg->quan);
	    cansee_hatchspot = cansee(x, y) && !silent;
	    if (!(mons[mnum].geno & G_UNIQ) &&
		   !(mvitals[mnum].mvflags & (G_GENOD | G_EXTINCT))) {
		for (i = hatchcount; i > 0; i--) {
		    if (!enexto(&cc, level, x, y, &mons[mnum]) ||
			 !(mon = makemon(&mons[mnum], level, cc.x, cc.y, NO_MINVENT)))
			break;
		    /* tame if your own egg hatches while you're on the
		       same dungeon level, or any dragon egg which hatches
		       while it's in your inventory */
		    if ((yours && !silent) ||
			(carried(egg) && mon->data->mlet == S_DRAGON)) {
			if ((mon2 = tamedog(mon, NULL)) != 0) {
			    mon = mon2;
			    if (carried(egg) && mon->data->mlet != S_DRAGON)
				mon->mtame = 20;
			}
		    }
		    if (mvitals[mnum].mvflags & G_EXTINCT)
			break;	/* just made last one */
		    mon2 = mon;	/* in case makemon() fails on 2nd egg */
		}
		if (!mon) mon = mon2;
		hatchcount -= i;
		egg->quan -= (long)hatchcount;
	    }
	}

	if (mon) {
	    char monnambuf[BUFSZ], carriedby[BUFSZ];
	    boolean siblings = (hatchcount > 1), redraw = FALSE;

	    if (cansee_hatchspot) {
		sprintf(monnambuf, "%s%s",
			siblings ? "some " : "",
			siblings ?
			makeplural(m_monnam(mon)) : an(m_monnam(mon)));
		/* we don't learn the egg type here because learning
		   an egg type requires either seeing the egg hatch
		   or being familiar with the egg already,
		   as well as being able to see the resulting
		   monster, checked below
		*/
	    }
	    switch (egg->where) {
		case OBJ_INVENT:
		    knows_egg = TRUE; /* true even if you are blind */
		    if (!cansee_hatchspot)
			pline("You feel something %s from your pack!",
			    locomotion(mon->data, "drop"));
		    else
			pline("You see %s %s out of your pack!",
			    monnambuf, locomotion(mon->data, "drop"));
		    if (yours) {
			pline("%s cries sound like \"%s%s\"",
			    siblings ? "Their" : "Its",
			    flags.female ? "mommy" : "daddy",
			    egg->spe ? "." : "?");
		    } else if (mon->data->mlet == S_DRAGON) {
			verbalize("Gleep!");		/* Mything eggs :-) */
		    }
		    break;

		case OBJ_FLOOR:
		    if (cansee_hatchspot) {
			knows_egg = TRUE;
			pline("You see %s hatch.", monnambuf);
			redraw = TRUE;	/* update egg's map location */
		    }
		    break;

		case OBJ_MINVENT:
		    if (cansee_hatchspot) {
			/* egg carring monster might be invisible */
			if (canseemon(level, egg->ocarry)) {
			    sprintf(carriedby, "%s pack",
				     s_suffix(a_monnam(egg->ocarry)));
			    knows_egg = TRUE;
			}
			else if (is_pool(level, mon->mx, mon->my))
			    strcpy(carriedby, "empty water");
			else
			    strcpy(carriedby, "thin air");
			pline("You see %s %s out of %s!", monnambuf,
			    locomotion(mon->data, "drop"), carriedby);
		    }
		    break;
		default:
		    warning("egg hatched where? (%d)", (int)egg->where);
		    break;
	    }

	    if (cansee_hatchspot && knows_egg)
		learn_egg_type(mnum);

	    if (egg->quan > 0) {
		/* still some eggs left */
		attach_egg_hatch_timeout(egg);
		if (egg->timed) {
		    /* replace ordinary egg timeout with a short one */
		    stop_timer(egg->olev, HATCH_EGG, egg);
		    start_timer(egg->olev, (long)rnd(12), TIMER_OBJECT,
					HATCH_EGG, egg);
		}
	    } else if (carried(egg)) {
		useup(egg);
	    } else {
		/* free egg here because we use it above */
		obj_extract_self(egg);
		obfree(egg, NULL);
	    }
	    if (redraw) newsym(x, y);
	}
}